

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::Joint::getAxes
          (Joint *this,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *axes)

{
  reference pvVar1;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *in_RSI;
  long *in_RDI;
  Joint *j;
  Matrix4x4 T;
  double in_stack_fffffffffffffce8;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *in_stack_fffffffffffffcf0;
  double local_308;
  Matrix4x4 *in_stack_fffffffffffffd00;
  Matrix4x4 *in_stack_fffffffffffffd08;
  Vector3D *in_stack_fffffffffffffd20;
  Matrix4x4 *in_stack_fffffffffffffd28;
  double local_2d0;
  Vector3D local_2c8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  undefined1 local_298 [128];
  undefined1 local_218 [128];
  undefined1 local_198 [128];
  undefined1 local_118 [128];
  long *local_98;
  undefined1 local_90 [128];
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *local_10;
  
  local_10 = in_RSI;
  (**(code **)(*in_RDI + 0x60))(local_90);
  for (local_98 = (long *)in_RDI[0x29]; local_98 != (long *)0x0; local_98 = (long *)local_98[0x29])
  {
    (**(code **)(*local_98 + 0x60))(local_198);
    Matrix4x4::operator*(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
    memcpy(local_90,local_118,0x80);
  }
  (**(code **)(**(long **)(in_RDI[0x28] + 0xf0) + 0x60))(local_298);
  Matrix4x4::operator*(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  memcpy(local_90,local_218,0x80);
  std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::resize
            (in_stack_fffffffffffffcf0,(size_type)in_stack_fffffffffffffce8);
  Vector3D::Vector3D(&local_2c8,1.0,0.0,0.0);
  Matrix4x4::operator*(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](local_10,0);
  pvVar1->x = local_2b0;
  pvVar1->y = local_2a8;
  pvVar1->z = local_2a0;
  Vector3D::Vector3D((Vector3D *)&stack0xfffffffffffffd08,0.0,1.0,0.0);
  Matrix4x4::operator*(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](local_10,1);
  pvVar1->x = (double)in_stack_fffffffffffffd20;
  pvVar1->y = (double)in_stack_fffffffffffffd28;
  pvVar1->z = local_2d0;
  Vector3D::Vector3D((Vector3D *)&stack0xfffffffffffffcd8,0.0,0.0,1.0);
  Matrix4x4::operator*(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  pvVar1 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[](local_10,2);
  pvVar1->x = (double)in_stack_fffffffffffffcf0;
  pvVar1->y = local_308;
  pvVar1->z = (double)in_stack_fffffffffffffd00;
  return;
}

Assistant:

void Joint::getAxes(vector<Vector3D>& axes) {
  Matrix4x4 T = getRotation();
  for (Joint* j = parent; j != nullptr; j = j->parent) {
    T = j->getRotation() * T;
  }
  T = skeleton->mesh->getRotation() * T;
  axes.resize(3);
  axes[0] = T * Vector3D(1., 0., 0.);
  axes[1] = T * Vector3D(0., 1., 0.);
  axes[2] = T * Vector3D(0., 0., 1.);
}